

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase31::run(TestCase31 *this)

{
  Reader reader;
  Reader reader_00;
  Builder builder_00;
  PointerType PVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Builder root;
  MallocMessageBuilder builder;
  StructBuilder in_stack_000002a0;
  StructBuilder local_248;
  OrphanBuilder local_218;
  OrphanBuilder local_1f8;
  ushort local_1d4;
  int local_1d0;
  PointerReader local_1c8;
  StructBuilder local_1a8;
  undefined8 in_stack_fffffffffffffea0;
  SegmentReader *in_stack_fffffffffffffea8;
  CapTableReader *in_stack_fffffffffffffeb0;
  void *in_stack_fffffffffffffeb8;
  WirePointer *in_stack_fffffffffffffec0;
  undefined8 local_138;
  undefined8 uStack_130;
  StructReader local_128;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c8,&local_f8.super_MessageBuilder);
  local_1f8.capTable = (CapTableBuilder *)local_1c8.pointer;
  local_1f8.tag.content = (uint64_t)local_1c8.segment;
  local_1f8.segment = (SegmentBuilder *)local_1c8.capTable;
  PointerBuilder::initStruct(&local_248,(PointerBuilder *)&local_1f8,(StructSize)0x140006);
  local_1f8.capTable = (CapTableBuilder *)(local_248.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_248.segment;
  local_1f8.segment = (SegmentBuilder *)local_248.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)&stack0xfffffffffffffe80,(PointerBuilder *)&local_1f8,
             (StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffea8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffea0;
  builder_00._builder.data = in_stack_fffffffffffffeb0;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffeb8;
  builder_00._builder._32_8_ = in_stack_fffffffffffffec0;
  initTestMessage(builder_00);
  local_1f8.capTable = (CapTableBuilder *)(local_248.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_248.segment;
  local_1f8.segment = (SegmentBuilder *)local_248.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_1f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x24,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
               (char (*) [39])"failed: expected root.hasStructField()");
  }
  local_1c8.pointer = local_248.pointers + 2;
  local_1c8.segment = &(local_248.segment)->super_SegmentReader;
  local_1c8.capTable = &(local_248.capTable)->super_CapTableReader;
  PointerBuilder::disown(&local_1f8,(PointerBuilder *)&local_1c8);
  local_218.segment = local_1f8.segment;
  local_218.capTable = local_1f8.capTable;
  local_218.location = local_1f8.location;
  local_218.tag.content = local_1f8.tag.content;
  if ((local_1f8.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x27,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
               (char (*) [38])"failed: expected !(orphan == nullptr)");
  }
  OrphanBuilder::asStructReader(&local_128,&local_218,(StructSize)0x140006);
  reader._reader.capTable = local_128.capTable;
  reader._reader.segment = local_128.segment;
  reader._reader.data = local_128.data;
  reader._reader.pointers = local_128.pointers;
  reader._reader.dataSize = local_128.dataSize;
  reader._reader.pointerCount = local_128.pointerCount;
  reader._reader._38_2_ = local_128._38_2_;
  reader._reader.nestingLimit = local_128.nestingLimit;
  reader._reader._44_4_ = local_128._44_4_;
  checkTestMessage(reader);
  OrphanBuilder::asStruct(&local_1a8,&local_218,(StructSize)0x140006);
  checkTestMessage((Builder)in_stack_000002a0);
  local_1f8.capTable = (CapTableBuilder *)(local_248.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_248.segment;
  local_1f8.segment = (SegmentBuilder *)local_248.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_1f8);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
               (char (*) [42])"failed: expected !(root.hasStructField())");
  }
  local_1f8.capTable = (CapTableBuilder *)(local_248.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_248.segment;
  local_1f8.segment = (SegmentBuilder *)local_248.capTable;
  PointerBuilder::adopt((PointerBuilder *)&local_1f8,&local_218);
  if ((local_218.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  local_1f8.capTable = (CapTableBuilder *)(local_248.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_248.segment;
  local_1f8.segment = (SegmentBuilder *)local_248.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_1f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2f,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
               (char (*) [39])"failed: expected root.hasStructField()");
  }
  StructBuilder::asReader(&local_248);
  local_1c8.pointer = (WirePointer *)(local_1f8.location + 2);
  if (local_1d4 < 3) {
    local_1c8.pointer = (WirePointer *)0x0;
  }
  if (local_1d4 < 3) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_1d0 = 0x7fffffff;
  }
  else {
    uVar2 = (undefined4)local_1f8.tag.content;
    uVar3 = local_1f8.tag.content._4_4_;
    uVar4 = local_1f8.segment._0_4_;
    uVar5 = local_1f8.segment._4_4_;
  }
  local_1c8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_1c8.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  local_1c8.nestingLimit = local_1d0;
  PointerReader::getStruct((StructReader *)&stack0xfffffffffffffea8,&local_1c8,(word *)0x0);
  reader_00._reader.capTable = in_stack_fffffffffffffeb0;
  reader_00._reader.segment = in_stack_fffffffffffffea8;
  reader_00._reader.data = in_stack_fffffffffffffeb8;
  reader_00._reader.pointers = in_stack_fffffffffffffec0;
  reader_00._reader._32_8_ = local_138;
  reader_00._reader._40_8_ = uStack_130;
  checkTestMessage(reader_00);
  if (local_218.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_218);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Any, AnyPointer) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initTestMessage(root.getAnyPointerField().initAs<TestAllTypes>());
  checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  root.getAnyPointerField().setAs<Text>("foo");
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());
  EXPECT_EQ("foo", root.asReader().getAnyPointerField().getAs<Text>());

  root.getAnyPointerField().setAs<Data>(data("foo"));
  EXPECT_EQ(data("foo"), root.getAnyPointerField().getAs<Data>());
  EXPECT_EQ(data("foo"), root.asReader().getAnyPointerField().getAs<Data>());

  {
    root.getAnyPointerField().setAs<List<uint32_t>>({123, 456, 789});

    {
      List<uint32_t>::Builder list = root.getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }

    {
      List<uint32_t>::Reader list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }
  }

  {
    root.getAnyPointerField().setAs<List<Text>>({"foo", "bar"});

    {
      List<Text>::Builder list = root.getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }

    {
      List<Text>::Reader list = root.asReader().getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }
  }

  {
    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().initAs<List<TestAllTypes>>(2);
      ASSERT_EQ(2u, list.size());
      initTestMessage(list[0]);
    }

    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }

    {
      List<TestAllTypes>::Reader list =
          root.asReader().getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }
  }
}